

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_int,_long_long,_6>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint *lhs,longlong *rhs,uint *result)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = *rhs;
  uVar1 = *lhs;
  if ((long)uVar2 < 0) {
    uVar2 = uVar1 - uVar2;
    if (uVar2 >> 0x20 != 0) goto LAB_0012f94c;
  }
  else {
    if (uVar1 < uVar2) {
LAB_0012f94c:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    uVar2 = (ulong)(uVar1 - (int)uVar2);
  }
  *result = (uint)uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an unsigned int32 or smaller, rhs std::int64_t
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (T)rhs );
                return;
            }
        }
        else
        {
            // we're now effectively adding
            // since lhs is 32-bit, and rhs cannot exceed 2^63
            // this addition cannot overflow
            std::uint64_t tmp = lhs + ~(std::uint64_t)( rhs ) + 1; // negation safe

            // but we could exceed MaxInt
            if(tmp <= std::numeric_limits<T>::max())
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }